

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O3

char * int2str::impl::detail<10000000ull>::convert_step<char*>(number_t x,char *iter)

{
  char *pcVar1;
  ulong uVar2;
  
  if (x < 10000000) {
    *iter = '0';
    if (999999 < x) {
      iter[1] = (char)((x & 0xffffffff) / 1000000) + '0';
      x = ((x & 0xffffffff) / 1000000) * -1000000 + x;
      if (99999 < x) {
        uVar2 = x / 100000;
        iter[2] = (char)uVar2 + '0';
LAB_001085f4:
        x = uVar2 * -100000 + x;
        goto LAB_00108628;
      }
LAB_00108584:
      iter[2] = '0';
      goto LAB_00108628;
    }
    iter[1] = '0';
    if (x < 100000) {
LAB_001085c1:
      iter[2] = '0';
      goto LAB_00108628;
    }
    uVar2 = (x >> 5 & 0x7ffffff) / 0xc35;
    iter[2] = (byte)uVar2 | 0x30;
  }
  else {
    *iter = (char)(x / 10000000) + '0';
    x = x % 10000000;
    if (x < 1000000) {
      iter[1] = '0';
      if (99999 < x) {
        uVar2 = x / 100000;
        iter[2] = (byte)uVar2 | 0x30;
        goto LAB_001085f4;
      }
      goto LAB_00108584;
    }
    iter[1] = (char)(x / 1000000) + '0';
    x = x % 1000000;
    if (x < 100000) goto LAB_001085c1;
    uVar2 = x / 100000;
    iter[2] = (char)uVar2 + '0';
  }
  x = uVar2 * -100000 + x;
LAB_00108628:
  pcVar1 = detail<10000ull>::convert_step<char*>(x,iter + 3);
  return pcVar1;
}

Assistant:

inline static Iter convert_step(number_t x, Iter iter)
    {
        if (N > x)
        {
            *iter++ = '0';
            return detail<N / 10u>::convert_step(x, iter);
        }
        auto const w = x / N;
        *iter++ = static_cast<char>('0' + w);
        return detail<N / 10u>::convert_step(x - w * N, iter);
    }